

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase646::run(TestCase646 *this)

{
  Own<kj::PromiseFulfiller<void>_> *params;
  undefined1 *__n;
  void *__buf;
  int in_R8D;
  bool local_34a;
  bool local_349;
  undefined1 local_348 [6];
  bool _kj_shouldLog_3;
  bool _kj_shouldLog_2;
  bool local_333;
  bool local_332;
  Type local_331;
  undefined1 local_330 [5];
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  Type local_319;
  Promise<void> local_318;
  Type local_301;
  Promise<void> local_300;
  Type local_2e9;
  Promise<void> local_2e8;
  Type local_2d1;
  Promise<void> local_2d0;
  Type local_2b9;
  Promise<void> local_2b8;
  undefined1 *local_2a0;
  Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
  local_298;
  Promise<void> local_260;
  Promise<void> local_250;
  Own<capnp::_::TestCapDestructor> local_240;
  Client local_230;
  Maybe<capnp::MessageSize> local_218;
  undefined1 local_200 [8];
  Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
  request;
  undefined1 local_1c0 [7];
  bool returned;
  Promise<void> promise;
  undefined1 local_1a0 [8];
  Client client;
  undefined1 *local_180;
  Promise<void> local_178;
  undefined1 local_168 [8];
  Promise<void> destructionPromise;
  bool destroyed;
  undefined1 local_148 [8];
  PromiseFulfillerPair<void> paf;
  TestContext context;
  TestCase646 *this_local;
  
  context.rpcServer.super_RpcSystemBase.impl.ptr = (Impl *)this;
  TestContext::TestContext((TestContext *)&paf.fulfiller.ptr);
  kj::newPromiseAndFulfiller<void>();
  destructionPromise.super_PromiseBase.node.ptr._3_1_ = 0;
  local_180 = (undefined1 *)((long)&destructionPromise.super_PromiseBase.node.ptr + 3);
  __n = &client.field_0x17;
  kj::Promise<void>::
  then<capnp::_::(anonymous_namespace)::TestCase646::run()::__0,kj::_::PropagateException>
            (&local_178,(Type *)local_148,(PropagateException *)&local_180);
  kj::Promise<void>::eagerlyEvaluate((Promise<void> *)local_168,&local_178);
  kj::Promise<void>::~Promise(&local_178);
  TestContext::connect
            ((TestContext *)&promise.super_PromiseBase.node.ptr,(int)&paf + 0x18,(sockaddr *)0x5,
             (socklen_t)__n);
  Capability::Client::castAs<capnproto_test::capnp::test::TestMoreStuff>
            ((Client *)local_1a0,(Client *)&promise.super_PromiseBase.node.ptr);
  Capability::Client::~Client((Client *)&promise.super_PromiseBase.node.ptr);
  kj::Promise<void>::Promise((Promise<void> *)local_1c0,(void *)0x0);
  request.hook.ptr._7_1_ = 0;
  kj::Maybe<capnp::MessageSize>::Maybe(&local_218,(void *)0x0);
  capnproto_test::capnp::test::TestMoreStuff::Client::expectCancelRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
              *)local_200,(Client *)local_1a0,&local_218);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_218);
  params = kj::mv<kj::Own<kj::PromiseFulfiller<void>>>
                     ((Own<kj::PromiseFulfiller<void>_> *)&paf.promise.super_PromiseBase.node.ptr);
  kj::heap<capnp::_::TestCapDestructor,kj::Own<kj::PromiseFulfiller<void>>>((kj *)&local_240,params)
  ;
  capnproto_test::capnp::test::TestInterface::Client::Client<capnp::_::TestCapDestructor,void>
            (&local_230,&local_240);
  capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams::Builder::setCap
            ((Builder *)local_200,&local_230);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_230);
  kj::Own<capnp::_::TestCapDestructor>::~Own(&local_240);
  Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
  ::send(&local_298,(int)local_200,__buf,(size_t)__n,in_R8D);
  local_2a0 = (undefined1 *)((long)&request.hook.ptr + 7);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>>::
  then<capnp::_::(anonymous_namespace)::TestCase646::run()::__1,kj::_::PropagateException>
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>>
              *)&local_260,(Type *)&local_298,(PropagateException *)&local_2a0);
  kj::Promise<void>::eagerlyEvaluate(&local_250,&local_260);
  kj::Promise<void>::operator=((Promise<void> *)local_1c0,&local_250);
  kj::Promise<void>::~Promise(&local_250);
  kj::Promise<void>::~Promise(&local_260);
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults> *)
             &local_298);
  Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
  ::~Request((Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
              *)local_200);
  kj::evalLater<capnp::_::(anonymous_namespace)::TestCase646::run()::__2>
            ((kj *)&local_2b8,&local_2b9);
  kj::Promise<void>::wait(&local_2b8,&context.loop.daemons.ptr);
  kj::Promise<void>::~Promise(&local_2b8);
  kj::evalLater<capnp::_::(anonymous_namespace)::TestCase646::run()::__3>
            ((kj *)&local_2d0,&local_2d1);
  kj::Promise<void>::wait(&local_2d0,&context.loop.daemons.ptr);
  kj::Promise<void>::~Promise(&local_2d0);
  kj::evalLater<capnp::_::(anonymous_namespace)::TestCase646::run()::__4>
            ((kj *)&local_2e8,&local_2e9);
  kj::Promise<void>::wait(&local_2e8,&context.loop.daemons.ptr);
  kj::Promise<void>::~Promise(&local_2e8);
  kj::evalLater<capnp::_::(anonymous_namespace)::TestCase646::run()::__5>
            ((kj *)&local_300,&local_301);
  kj::Promise<void>::wait(&local_300,&context.loop.daemons.ptr);
  kj::Promise<void>::~Promise(&local_300);
  kj::evalLater<capnp::_::(anonymous_namespace)::TestCase646::run()::__6>
            ((kj *)&local_318,&local_319);
  kj::Promise<void>::wait(&local_318,&context.loop.daemons.ptr);
  kj::Promise<void>::~Promise(&local_318);
  kj::evalLater<capnp::_::(anonymous_namespace)::TestCase646::run()::__7>
            ((kj *)local_330,&local_331);
  kj::Promise<void>::wait((Promise<void> *)local_330,&context.loop.daemons.ptr);
  kj::Promise<void>::~Promise((Promise<void> *)local_330);
  if ((destructionPromise.super_PromiseBase.node.ptr._3_1_ & 1) != 0) {
    local_332 = kj::_::Debug::shouldLog(ERROR);
    while (local_332 != false) {
      kj::_::Debug::log<char_const(&)[30]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x2a5,ERROR,"\"failed: expected \" \"!(destroyed)\"",
                 (char (*) [30])"failed: expected !(destroyed)");
      local_332 = false;
    }
  }
  if ((request.hook.ptr._7_1_ & 1) != 0) {
    local_333 = kj::_::Debug::shouldLog(ERROR);
    while (local_333 != false) {
      kj::_::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x2a6,ERROR,"\"failed: expected \" \"!(returned)\"",
                 (char (*) [29])"failed: expected !(returned)");
      local_333 = false;
    }
  }
  kj::Promise<void>::Promise((Promise<void> *)local_348,(void *)0x0);
  kj::Promise<void>::operator=((Promise<void> *)local_1c0,(Promise<void> *)local_348);
  kj::Promise<void>::~Promise((Promise<void> *)local_348);
  kj::Promise<void>::wait((Promise<void> *)local_168,&context.loop.daemons.ptr);
  if ((destructionPromise.super_PromiseBase.node.ptr._3_1_ & 1) == 0) {
    local_349 = kj::_::Debug::shouldLog(ERROR);
    while (local_349 != false) {
      kj::_::Debug::log<char_const(&)[27]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x2ab,ERROR,"\"failed: expected \" \"destroyed\"",
                 (char (*) [27])"failed: expected destroyed");
      local_349 = false;
    }
  }
  if ((request.hook.ptr._7_1_ & 1) != 0) {
    local_34a = kj::_::Debug::shouldLog(ERROR);
    while (local_34a != false) {
      kj::_::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x2ac,ERROR,"\"failed: expected \" \"!(returned)\"",
                 (char (*) [29])"failed: expected !(returned)");
      local_34a = false;
    }
  }
  kj::Promise<void>::~Promise((Promise<void> *)local_1c0);
  capnproto_test::capnp::test::TestMoreStuff::Client::~Client((Client *)local_1a0);
  kj::Promise<void>::~Promise((Promise<void> *)local_168);
  kj::PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)local_148);
  TestContext::~TestContext((TestContext *)&paf.fulfiller.ptr);
  return;
}

Assistant:

TEST(Rpc, Cancelation) {
  // Tests allowCancellation().

  TestContext context;

  auto paf = kj::newPromiseAndFulfiller<void>();
  bool destroyed = false;
  auto destructionPromise = paf.promise.then([&]() { destroyed = true; }).eagerlyEvaluate(nullptr);

  auto client = context.connect(test::TestSturdyRefObjectId::Tag::TEST_MORE_STUFF)
      .castAs<test::TestMoreStuff>();

  kj::Promise<void> promise = nullptr;

  bool returned = false;
  {
    auto request = client.expectCancelRequest();
    request.setCap(kj::heap<TestCapDestructor>(kj::mv(paf.fulfiller)));
    promise = request.send().then(
        [&](Response<test::TestMoreStuff::ExpectCancelResults>&& response) {
      returned = true;
    }).eagerlyEvaluate(nullptr);
  }
  kj::evalLater([]() {}).wait(context.waitScope);
  kj::evalLater([]() {}).wait(context.waitScope);
  kj::evalLater([]() {}).wait(context.waitScope);
  kj::evalLater([]() {}).wait(context.waitScope);
  kj::evalLater([]() {}).wait(context.waitScope);
  kj::evalLater([]() {}).wait(context.waitScope);

  // We can detect that the method was canceled because it will drop the cap.
  EXPECT_FALSE(destroyed);
  EXPECT_FALSE(returned);

  promise = nullptr;  // request cancellation
  destructionPromise.wait(context.waitScope);

  EXPECT_TRUE(destroyed);
  EXPECT_FALSE(returned);
}